

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

void __thiscall
kratos::SystemVerilogCodeGen::output_module_def(SystemVerilogCodeGen *this,Generator *generator)

{
  string *psVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  ostream *poVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  ulong uVar5;
  basic_string_view<char> bVar6;
  string_view sVar7;
  shared_ptr<kratos::Stmt> sVar8;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  pointer local_68;
  size_type sStack_60;
  undefined1 local_58 [40];
  
  if ((this->options_).package_name._M_string_length != 0) {
    psVar1 = &(this->options_).package_name;
    puVar2 = &(this->stream_).super_stringstream.field_0x10;
    poVar4 = std::operator<<((ostream *)puVar2,"`include \"");
    poVar4 = std::operator<<(poVar4,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,".svh\"");
    puVar3 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar3 = *(long *)puVar3 + 1;
    poVar4 = std::operator<<(poVar4,'\n');
    puVar3 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar3 = *(long *)puVar3 + 1;
    std::operator<<(poVar4,'\n');
    poVar4 = std::operator<<((ostream *)puVar2,"import ");
    poVar4 = std::operator<<(poVar4,(string *)psVar1);
    poVar4 = std::operator<<(poVar4,"::*;");
    puVar2 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar2 = *(long *)puVar2 + 1;
    std::operator<<(poVar4,'\n');
  }
  if (generator->debug == true) {
    (generator->super_IRNode).verilog_ln =
         *(uint32_t *)&(this->stream_).super_stringstream.field_0x90;
  }
  puVar2 = &(this->stream_).super_stringstream.field_0x10;
  local_68 = (generator->name)._M_dataplus._M_p;
  sStack_60 = (generator->name)._M_string_length;
  bVar6 = fmt::v7::to_string_view<char,_0>("module {0} ");
  format_str.data_ = (char *)bVar6.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68;
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_58,(detail *)bVar6.data_,format_str,args);
  std::operator<<((ostream *)puVar2,(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  generate_module_package_import(this,generator);
  generate_parameters(this,generator);
  sVar7 = indent(this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar2,sVar7._M_str,sVar7._M_len);
  poVar4 = std::operator<<(poVar4,"(");
  puVar3 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar3 = *(long *)puVar3 + 1;
  std::operator<<(poVar4,'\n');
  generate_ports(this,generator);
  sVar7 = indent(this);
  local_58._32_8_ = puVar2;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar2,sVar7._M_str,sVar7._M_len);
  poVar4 = std::operator<<(poVar4,");");
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  poVar4 = std::operator<<(poVar4,'\n');
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  std::operator<<(poVar4,'\n');
  generate_enums(this,generator);
  generate_variables(this,generator);
  generate_interface(this,generator);
  generate_functions(this,generator);
  for (uVar5 = 0;
      uVar5 < (ulong)((long)(generator->stmts_).
                            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(generator->stmts_).
                            super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar5 = uVar5 + 1) {
    sVar8 = Generator::get_stmt((Generator *)local_58,(uint32_t)generator);
    (**this->_vptr_SystemVerilogCodeGen)
              (this,local_58._0_8_,
               sVar8.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _M_pi);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  }
  local_68 = (generator->name)._M_dataplus._M_p;
  sStack_60 = (generator->name)._M_string_length;
  bVar6 = fmt::v7::to_string_view<char,_0>("endmodule   // {0}");
  format_str_00.data_ = (char *)bVar6.size_;
  format_str_00.size_ = 0xd;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)local_58,(detail *)bVar6.data_,format_str_00,args_00);
  poVar4 = std::operator<<((ostream *)local_58._32_8_,(string *)local_58);
  puVar2 = &(this->stream_).super_stringstream.field_0x90;
  *(long *)puVar2 = *(long *)puVar2 + 1;
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void SystemVerilogCodeGen::output_module_def(Generator* generator) {  // output module definition
    // insert the header definition, if necessary
    if (!options_.package_name.empty()) {
        // two line indent
        stream_ << "`include \"" << options_.package_name << ".svh\"" << stream_.endl()
                << stream_.endl();
        // import everything
        stream_ << "import " << options_.package_name << "::*;" << stream_.endl();
    }
    if (generator->debug) generator->verilog_ln = stream_.line_no();
    stream_ << ::format("module {0} ", generator->name);
    generate_module_package_import(generator);
    generate_parameters(generator);
    stream_ << indent() << "(" << stream_.endl();
    generate_ports(generator);
    stream_ << indent() << ");" << stream_.endl() << stream_.endl();
    generate_enums(generator);
    generate_variables(generator);
    generate_interface(generator);
    generate_functions(generator);

    for (uint64_t i = 0; i < generator->stmts_count(); i++) {
        dispatch_node(generator->get_stmt(i).get());
    }

    stream_ << ::format("endmodule   // {0}", generator->name) << stream_.endl();
}